

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

string * __thiscall
spectest::JSONParser::CreateModulePath_abi_cxx11_
          (string *__return_storage_ptr__,JSONParser *this,string_view filename)

{
  size_type sVar1;
  pointer pcVar2;
  ulong n;
  size_type sVar3;
  size_type sVar4;
  string_view dirname;
  string_view local_58;
  string local_48;
  string_view local_28;
  
  local_58.size_ = filename.size_;
  local_58.data_ = filename.data_;
  local_48._M_dataplus._M_p = (this->loc_).filename.data_;
  local_48._M_string_length = (this->loc_).filename.size_;
  n = wabt::string_view::find_last_of((string_view *)&local_48,'/',0xffffffffffffffff);
  sVar3 = wabt::string_view::find_last_of((string_view *)&local_48,'\\',0xffffffffffffffff);
  if (n == 0xffffffffffffffff) {
    n = 0;
  }
  if (sVar3 == 0xffffffffffffffff) {
    sVar3 = 0;
  }
  if (n <= sVar3) {
    n = sVar3;
  }
  local_28 = wabt::string_view::substr((string_view *)&local_48,0,n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_28.size_ == 0) {
    wabt::string_view::to_string_abi_cxx11_(&local_48,&local_58);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_0016daa5;
  }
  else {
    wabt::string_view::to_string_abi_cxx11_(&local_48,&local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    wabt::string_view::to_string_abi_cxx11_(&local_48,&local_58);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_0016daa5;
  }
  operator_delete(local_48._M_dataplus._M_p);
LAB_0016daa5:
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      if (pcVar2[sVar4] == '\\') {
        pcVar2[sVar4] = '/';
      }
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSONParser::CreateModulePath(string_view filename) {
  string_view spec_json_filename = loc_.filename;
  string_view dirname = GetDirname(spec_json_filename);
  std::string path;

  if (dirname.size() == 0) {
    path = filename.to_string();
  } else {
    path = dirname.to_string();
    path += '/';
    path += filename.to_string();
  }

  ConvertBackslashToSlash(&path);
  return path;
}